

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicKReach.cpp
# Opt level: O3

void __thiscall
DynamicKReach::update_remove
          (DynamicKReach *this,vertex_t v,vector<unsigned_int,_std::allocator<unsigned_int>_> *out,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *dist)

{
  pointer puVar1;
  pointer puVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar4 = (ulong)v;
  puVar1 = (dist->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar3 = (long)(dist->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)puVar1;
  if (uVar3 <= uVar4) {
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar4,
               uVar3);
  }
  if (this->k_ < puVar1[uVar4]) {
    return;
  }
  puVar1[uVar4] = '?';
  puVar2 = (this->updated_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->updated_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar2) {
    (this->updated_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar2;
  }
  collect_changes(this,out,dist);
  fix_changes(this,dist);
  return;
}

Assistant:

void DynamicKReach::update_remove(vertex_t v, const std::vector<vertex_t> &out, std::vector<distance_t> &dist) {
    if (dist.at(v) > k_) {
        return;
    }
    dist.at(v) = INF8;
    updated_.clear();
    collect_changes(out, dist);
    fix_changes(dist);
}